

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O3

bool __thiscall opencollada::ArgumentParser::parseArguments(ArgumentParser *this)

{
  iterator iVar1;
  ulong uVar2;
  _Rb_tree_node_base *p_Var3;
  MissingArgumentParameterException *this_00;
  MissingArgumentException *pMVar4;
  UnknowArgumentException *this_01;
  ulong uVar5;
  pointer pAVar6;
  ulong uVar7;
  pointer pbVar8;
  _Base_ptr p_Var9;
  long lVar10;
  
  pbVar8 = (this->mCommandLine).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(this->mCommandLine).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
    pAVar6 = (this->mNoSwitchArguments).
             super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = 1;
    do {
      iVar1 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
                      *)this,pbVar8 + uVar7);
      if ((_Rb_tree_header *)iVar1._M_node == &(this->mArguments)._M_t._M_impl.super__Rb_tree_header
         ) {
        if (pAVar6 == (this->mNoSwitchArguments).
                      super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          this_01 = (UnknowArgumentException *)__cxa_allocate_exception(0x48);
          UnknowArgumentException::UnknowArgumentException
                    (this_01,(this->mCommandLine).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar7);
          __cxa_throw(this_01,&UnknowArgumentException::typeinfo,
                      UnknowArgumentException::~UnknowArgumentException);
        }
        ::std::__cxx11::string::_M_assign
                  ((string *)
                   (pAVar6->mValues).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        pAVar6->mSet = true;
        pAVar6 = pAVar6 + 1;
        uVar7 = uVar7 + 1;
      }
      else {
        *(undefined1 *)&iVar1._M_node[5]._M_left = 1;
        p_Var9 = *(_Base_ptr *)(iVar1._M_node + 2);
        if (iVar1._M_node[2]._M_parent == p_Var9) {
          uVar2 = 0;
        }
        else {
          lVar10 = 0;
          uVar5 = 0;
          do {
            if ((ulong)((long)(this->mCommandLine).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mCommandLine).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5 + uVar7 + 1)
            {
              this_00 = (MissingArgumentParameterException *)__cxa_allocate_exception(0x48);
              MissingArgumentParameterException::MissingArgumentParameterException
                        (this_00,(this->mCommandLine).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
              __cxa_throw(this_00,&MissingArgumentParameterException::typeinfo,
                          MissingArgumentParameterException::~MissingArgumentParameterException);
            }
            ::std::__cxx11::string::_M_assign((string *)((long)&p_Var9->_M_color + lVar10));
            uVar5 = uVar5 + 1;
            p_Var9 = *(_Base_ptr *)(iVar1._M_node + 2);
            uVar2 = (long)iVar1._M_node[2]._M_parent - (long)p_Var9 >> 5;
            lVar10 = lVar10 + 0x20;
          } while (uVar5 < uVar2);
        }
        uVar7 = uVar7 + 1 + uVar2;
      }
      pbVar8 = (this->mCommandLine).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->mCommandLine).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5));
  }
  p_Var3 = (this->mArguments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(this->mArguments)._M_t._M_impl.super__Rb_tree_header) {
      pAVar6 = (this->mNoSwitchArguments).
               super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pAVar6 == (this->mNoSwitchArguments).
                      super__Vector_base<opencollada::Argument,_std::allocator<opencollada::Argument>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        if ((pAVar6->mRequired == true) && (pAVar6->mSet == false)) break;
        pAVar6 = pAVar6 + 1;
      }
      pMVar4 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
      MissingArgumentException::MissingArgumentException(pMVar4,&pAVar6->mHint);
      __cxa_throw(pMVar4,&MissingArgumentException::typeinfo,
                  MissingArgumentException::~MissingArgumentException);
    }
    if ((*(char *)((long)&p_Var3[5]._M_left + 1) == '\x01') && (*(char *)&p_Var3[5]._M_left == '\0')
       ) break;
    p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
  }
  pMVar4 = (MissingArgumentException *)__cxa_allocate_exception(0x48);
  MissingArgumentException::MissingArgumentException(pMVar4,(string *)(p_Var3 + 1));
  __cxa_throw(pMVar4,&MissingArgumentException::typeinfo,
              MissingArgumentException::~MissingArgumentException);
}

Assistant:

bool ArgumentParser::parseArguments()
	{
		try
		{
			auto noSwitchArgumentIt = mNoSwitchArguments.begin();
			for (size_t arg = 1; arg < mCommandLine.size();)
			{
				auto it = mArguments.find(mCommandLine[arg]);
				if (it == mArguments.end())
				{
					if (noSwitchArgumentIt != mNoSwitchArguments.end())
					{
						Argument& argument = *noSwitchArgumentIt;
						argument.setValue(mCommandLine[arg]);
						argument.isSet(true);
						++noSwitchArgumentIt;
						++arg;
						continue;
					}

                    throw UnknowArgumentException(mCommandLine[arg]);
				}

				Argument & argument = it->second;
				argument.isSet(true);
				for (size_t subArg = 0; subArg < argument.getNumParameters(); ++subArg)
				{
					size_t index = arg + subArg + 1;
					if (index >= mCommandLine.size())
					{
                        throw MissingArgumentParameterException(mCommandLine[arg]);
					}
					argument.setValue(mCommandLine[index], subArg);
				}
				arg += 1 + argument.getNumParameters();
			}

			for (const auto & argument : mArguments)
			{
				if (argument.second.isRequired() && !argument.second.isSet())
				{
                    throw MissingArgumentException(argument.first);
				}
			}

			for (const auto & argument : mNoSwitchArguments)
			{
				if (argument.isRequired() && !argument.isSet())
				{
					throw MissingArgumentException(argument.getHint());
				}
			}
		}
		catch (exception& e)
		{
			mParseError = e.what();
			return false;
		}
		return true;
	}